

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::HMMSegment::Cut
          (HMMSegment *this,string *sentence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words)

{
  undefined1 local_38 [8];
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *words_local;
  string *sentence_local;
  HMMSegment *this_local;
  
  tmp.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)words;
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_38);
  Cut(this,sentence,(vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_38);
  GetStringsFromWords((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_38,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)tmp.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_38);
  return;
}

Assistant:

void Cut(const string& sentence, 
        vector<string>& words) const {
    vector<Word> tmp;
    Cut(sentence, tmp);
    GetStringsFromWords(tmp, words);
  }